

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_colors(char *title,wchar_t row)

{
  menu *pmVar1;
  
  screen_save();
  clear_from(L'\0');
  if (color_menu == (menu *)0x0) {
    pmVar1 = menu_new_action(color_events,3);
    color_menu = pmVar1;
    pmVar1->title = title;
    pmVar1->selections = "abcdefghijklmnopqrstuvwxyz";
    pmVar1->browse_hook = colors_browse_hook;
  }
  menu_layout(color_menu,&SCREEN_REGION);
  menu_select(color_menu,0,false);
  screen_load();
  return;
}

Assistant:

static void do_cmd_colors(const char *title, int row)
{
	screen_save();
	clear_from(0);

	if (!color_menu)
	{
		color_menu = menu_new_action(color_events,
			N_ELEMENTS(color_events));

		color_menu->title = title;
		color_menu->selections = lower_case;
		color_menu->browse_hook = colors_browse_hook;
	}

	menu_layout(color_menu, &SCREEN_REGION);
	menu_select(color_menu, 0, false);

	screen_load();
}